

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O0

void __thiscall
diy::Collection::Collection
          (Collection *this,Create *create__,Destroy *destroy__,ExternalStorage *storage__,
          Save *save__,Load *load__)

{
  undefined8 in_RCX;
  long in_RDI;
  critical_resource<int,_std::recursive_mutex> *this_00;
  int *in_stack_ffffffffffffff68;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffff78;
  function<void_(const_void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffff80;
  
  std::function<void_*()>::function
            ((function<void_*()> *)in_stack_ffffffffffffff80,
             (function<void_*()> *)in_stack_ffffffffffffff78);
  std::function<void_(void_*)>::function
            ((function<void_(void_*)> *)in_stack_ffffffffffffff80,
             (function<void_(void_*)> *)in_stack_ffffffffffffff78);
  *(undefined8 *)(in_RDI + 0x40) = in_RCX;
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
            (in_stack_ffffffffffffff80,
             (function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffff78);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)(in_RDI + 0x68),
             in_stack_ffffffffffffff78);
  this_00 = (critical_resource<int,_std::recursive_mutex> *)(in_RDI + 0x88);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)0x115e44);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x115e5a);
  critical_resource<int,_std::recursive_mutex>::critical_resource(this_00,in_stack_ffffffffffffff68)
  ;
  return;
}

Assistant:

Collection(Create               create__,
                               Destroy              destroy__,
                               ExternalStorage*     storage__,
                               Save                 save__,
                               Load                 load__):
                        create_(create__),
                        destroy_(destroy__),
                        storage_(storage__),
                        save_(save__),
                        load_(load__),
                        in_memory_(0)               {}